

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

void connection_close_cb(uv_handle_t *handle)

{
  int *piVar1;
  void *__ptr;
  undefined8 uVar2;
  char *pcVar3;
  
  __ptr = handle->data;
  piVar1 = (int *)((long)__ptr + 0x154);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (test_mode == '\x01') {
    if (*(int *)((long)__ptr + 0x150) == 0) {
      if (*(long *)((long)__ptr + 0x140) != 0) {
        pcVar3 = "context->read == 0";
        uVar2 = 0xb8;
        goto LAB_001423c5;
      }
LAB_00142362:
      if (*(long *)((long)__ptr + 0x148) == 0x10000) {
LAB_0014236f:
        closed_connections = closed_connections + 1;
        free(__ptr);
        return;
      }
      pcVar3 = "context->sent == TRANSFER_BYTES";
      uVar2 = 0xbc;
      goto LAB_001423c5;
    }
    if (*(long *)((long)__ptr + 0x140) == 0x10000) {
      if (*(long *)((long)__ptr + 0x148) != 0) {
        pcVar3 = "context->sent == 0";
        uVar2 = 0xbe;
        goto LAB_001423c5;
      }
      goto LAB_0014236f;
    }
  }
  else if (*(long *)((long)__ptr + 0x140) == 0x10000) goto LAB_00142362;
  pcVar3 = "context->read == TRANSFER_BYTES";
  uVar2 = 0xb6;
LAB_001423c5:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-poll.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void connection_close_cb(uv_handle_t* handle) {
  connection_context_t* context = (connection_context_t*) handle->data;

  if (--context->open_handles == 0) {
    if (test_mode == DUPLEX || context->is_server_connection) {
      ASSERT(context->read == TRANSFER_BYTES);
    } else {
      ASSERT(context->read == 0);
    }

    if (test_mode == DUPLEX || !context->is_server_connection) {
      ASSERT(context->sent == TRANSFER_BYTES);
    } else {
      ASSERT(context->sent == 0);
    }

    closed_connections++;

    free(context);
  }
}